

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

void __thiscall
cfd::TransactionContext::CollectInputUtxo
          (TransactionContext *this,vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos)

{
  pointer *utxo_data;
  pointer pUVar1;
  pointer pUVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  Txid *pTVar7;
  long lVar8;
  OutPoint outpoint;
  Utxo temp;
  UtxoData dest;
  Txid local_640;
  OutPoint local_620;
  Utxo local_5f8;
  UtxoData local_520;
  
  if ((utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    pUVar1 = (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pUVar2 = (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = cfd::core::Transaction::GetTxInCount();
    if (((long)pUVar1 - (long)pUVar2) / 0x4f0 != (ulong)uVar6) {
      lVar3 = *(long *)&this->field_0x18;
      for (lVar8 = *(long *)&this->field_0x10; lVar8 != lVar3; lVar8 = lVar8 + 0x90) {
        cfd::core::AbstractTxIn::GetTxid();
        uVar6 = cfd::core::AbstractTxIn::GetVout();
        cfd::core::OutPoint::OutPoint(&local_620,&local_640,uVar6);
        bVar4 = IsFindUtxoMap(this,&local_620,(UtxoData *)0x0);
        if (!bVar4) {
          pUVar1 = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          pTVar7 = &((utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
                     _M_impl.super__Vector_impl_data._M_start)->txid;
          while (utxo_data = &pTVar7[-2].data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                (pointer)utxo_data != pUVar1) {
            if (*(uint *)&pTVar7[1]._vptr_Txid == uVar6) {
              cVar5 = cfd::core::Txid::Equals(pTVar7);
              if (cVar5 != '\0') {
                UtxoData::UtxoData(&local_520);
                memset(&local_5f8,0,0xd8);
                UtxoUtil::ConvertToUtxo((UtxoData *)utxo_data,&local_5f8,&local_520);
                std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::
                emplace_back<cfd::UtxoData&>
                          ((vector<cfd::UtxoData,std::allocator<cfd::UtxoData>> *)&this->utxo_map_,
                           &local_520);
                UtxoData::~UtxoData(&local_520);
                break;
              }
            }
            pTVar7 = (Txid *)&pTVar7[0x27].data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
          }
        }
        core::Txid::~Txid(&local_620.txid_);
        core::Txid::~Txid(&local_640);
      }
    }
  }
  return;
}

Assistant:

void TransactionContext::CollectInputUtxo(const std::vector<UtxoData>& utxos) {
  if ((!utxos.empty()) && (utxo_map_.size() != GetTxInCount())) {
    for (const auto& txin_ref : vin_) {
      const Txid& txid = txin_ref.GetTxid();
      uint32_t vout = txin_ref.GetVout();

      OutPoint outpoint(txid, vout);
      if (!IsFindUtxoMap(outpoint)) {
        for (const auto& utxo : utxos) {
          if ((utxo.vout == vout) && utxo.txid.Equals(txid)) {
            UtxoData dest;
            Utxo temp;
            memset(&temp, 0, sizeof(temp));
            UtxoUtil::ConvertToUtxo(utxo, &temp, &dest);
            utxo_map_.emplace_back(dest);
            break;
          }
        }
      }
    }
  }
}